

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# view.cpp
# Opt level: O0

void __thiscall r_exec::View::delete_from_group(View *this)

{
  lock_guard<std::mutex> local_20;
  lock_guard<std::mutex> guard;
  Group *g;
  View *this_local;
  
  guard._M_device = (mutex_type *)get_host(this);
  std::lock_guard<std::mutex>::lock_guard(&local_20,&((Group *)guard._M_device)->mutex);
  Group::delete_view((Group *)guard._M_device,this);
  std::lock_guard<std::mutex>::~lock_guard(&local_20);
  return;
}

Assistant:

void View::delete_from_group()
{
    Group *g = get_host();
    std::lock_guard<std::mutex> guard(g->mutex);
    g->delete_view(this);
}